

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

int GA_Assemble_duplicate(int g_a,char *array_name,void *ptr)

{
  global_array_t *pgVar1;
  int handle;
  int iVar2;
  char **ppcVar3;
  C_Integer *pCVar4;
  bool bVar5;
  global_array_t *pgVar6;
  global_array_t *pgVar7;
  uint uVar8;
  uint uVar9;
  C_Integer *pCVar10;
  Integer IVar11;
  int *piVar12;
  long lVar13;
  ulong uVar14;
  long *plVar15;
  ulong uVar16;
  char err_string [256];
  char local_138 [264];
  
  iVar2 = (int)GAnproc * 8;
  handle = g_a + 1000;
  uVar8 = calc_maplen(handle);
  pnga_sync();
  GAstat.numcre = GAstat.numcre + 1;
  if ((g_a < -1000) || (_max_global_array <= handle)) {
    sprintf(local_138,"%s: INVALID ARRAY HANDLE","ga_assemble_duplicate");
    pnga_error(local_138,(long)g_a);
  }
  if (GA[handle].actv == 0) {
    sprintf(local_138,"%s: ARRAY NOT ACTIVE","ga_assemble_duplicate");
    pnga_error(local_138,(long)g_a);
  }
  plVar15 = (long *)((long)ptr - (long)(iVar2 + 0x20));
  piVar12 = &GA->actv_handle;
  uVar9 = 0xffffffff;
  lVar13 = 1;
  do {
    iVar2 = *piVar12;
    uVar9 = uVar9 + 1;
    if (iVar2 == 0) break;
    piVar12 = piVar12 + 0xda;
    bVar5 = lVar13 < _max_global_array;
    lVar13 = lVar13 + 1;
  } while (bVar5);
  uVar9 = -(uint)(iVar2 != 0) | uVar9;
  if (iVar2 != 0) {
    pnga_error("ga_assemble_duplicate: too many arrays ",(long)_max_global_array);
  }
  gai_init_struct(uVar9);
  pgVar7 = GA;
  pgVar1 = GA + (int)uVar9;
  pgVar6 = GA + (int)uVar9;
  GA[(int)uVar9].actv_handle = 1;
  ppcVar3 = pgVar7[(int)uVar9].ptr;
  memcpy(pgVar1,pgVar7 + handle,0x368);
  strcpy(pgVar6->name,array_name);
  GA[(int)uVar9].ptr = ppcVar3;
  if (0 < (int)uVar8) {
    uVar16 = (ulong)uVar8;
    pCVar10 = (C_Integer *)malloc(uVar16 * 8 + 8);
    GA[(int)uVar9].mapc = pCVar10;
    pCVar10 = GA[handle].mapc;
    pCVar4 = GA[(int)uVar9].mapc;
    uVar14 = 0;
    do {
      pCVar4[uVar14] = pCVar10[uVar14];
      uVar14 = uVar14 + 1;
    } while (uVar16 != uVar14);
    GA[(int)uVar9].mapc[uVar16] = -1;
  }
  IVar11 = pnga_type_f2c(plVar15[1]);
  if (999 < IVar11) {
    IVar11 = pnga_type_f2c(plVar15[1]);
    if (IVar11 < 0x4e8) {
      IVar11 = pnga_type_f2c(plVar15[1]);
      if ((&DWORD_001d3540)[IVar11 * 4] != 0) goto LAB_001142f8;
    }
  }
  IVar11 = pnga_type_f2c(plVar15[1]);
  pnga_error("type not yet supported",IVar11);
LAB_001142f8:
  IVar11 = pnga_type_f2c(plVar15[1]);
  pgVar1 = GA;
  GA[(int)uVar9].type = (int)IVar11;
  pgVar1[(int)uVar9].size = plVar15[2];
  pgVar1[(int)uVar9].id = *plVar15;
  memcpy(pgVar1[(int)uVar9].ptr,plVar15 + 4,CONCAT44(GAnproc._4_4_,(int)GAnproc) << 3);
  GAstat.curmem = GAstat.curmem + GA[(int)uVar9].size;
  lVar13 = GAstat.curmem;
  if (GAstat.curmem < GAstat.maxmem) {
    lVar13 = GAstat.maxmem;
  }
  GAstat.maxmem = lVar13;
  pnga_sync();
  return uVar9 - 1000;
}

Assistant:

int GA_Assemble_duplicate(int g_a, char* array_name, void* ptr)
{
char     **save_ptr;
int      i, ga_handle;
int extra = sizeof(getmem_t)+GAnproc*sizeof(char*);
getmem_t *info = (getmem_t *)((char*)ptr - extra);
char **ptr_arr = (char**)(info+1);
int g_b;
int maplen = calc_maplen(GA_OFFSET + g_a);


      pnga_sync();

      GAstat.numcre ++;

      ga_check_handleM(g_a,"ga_assemble_duplicate");

      /* find a free global_array handle for g_b */
      ga_handle =-1; i=0;
      do{
        if(!GA[i].actv_handle) ga_handle=i;
        i++;
      }while(i<_max_global_array && ga_handle==-1);
      if( ga_handle == -1)
          pnga_error("ga_assemble_duplicate: too many arrays ", 
                                           (Integer)_max_global_array);
      g_b = ga_handle - GA_OFFSET;

      gai_init_struct(ga_handle);
      GA[ga_handle].actv_handle = 1;

      /*** copy content of the data structure ***/
      save_ptr = GA[ga_handle].ptr;
      GA[ga_handle] = GA[GA_OFFSET + g_a];
      strcpy(GA[ga_handle].name, array_name);
      GA[ga_handle].ptr = save_ptr;
      if (maplen > 0) {
        GA[ga_handle].mapc = (C_Integer*)malloc((maplen+1)*sizeof(C_Integer*));
        for(i=0;i<maplen; i++)GA[ga_handle].mapc[i] = GA[GA_OFFSET+ g_a].mapc[i];
        GA[ga_handle].mapc[maplen] = -1;
      }

      /* get ptrs and datatype from user memory */
      gam_checktype(pnga_type_f2c(info->type));
      GA[ga_handle].type = pnga_type_f2c(info->type);
      GA[ga_handle].size = (C_Long)info->size;
      GA[ga_handle].id = info->id;
      memcpy(GA[ga_handle].ptr,ptr_arr,(size_t)GAnproc*sizeof(char**));

      GAstat.curmem += (long)GA[ga_handle].size;
      GAstat.maxmem  = (long)GA_MAX(GAstat.maxmem, GAstat.curmem);

      pnga_sync();

      return(g_b);
}